

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walIndexWriteHdr(Wal *pWal)

{
  WalIndexHdr *__dest;
  Wal *in_RDI;
  int nCksum;
  WalIndexHdr *aHdr;
  
  __dest = walIndexHdr(in_RDI);
  (in_RDI->hdr).isInit = '\x01';
  (in_RDI->hdr).iVersion = 0x2de218;
  walChecksumBytes(1,(u8 *)&in_RDI->hdr,0x28,(u32 *)0x0,(in_RDI->hdr).aCksum);
  memcpy(__dest + 1,&in_RDI->hdr,0x30);
  walShmBarrier((Wal *)0x148594);
  memcpy(__dest,&in_RDI->hdr,0x30);
  return;
}

Assistant:

static void walIndexWriteHdr(Wal *pWal){
  volatile WalIndexHdr *aHdr = walIndexHdr(pWal);
  const int nCksum = offsetof(WalIndexHdr, aCksum);

  assert( pWal->writeLock );
  pWal->hdr.isInit = 1;
  pWal->hdr.iVersion = WALINDEX_MAX_VERSION;
  walChecksumBytes(1, (u8*)&pWal->hdr, nCksum, 0, pWal->hdr.aCksum);
  memcpy((void*)&aHdr[1], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
  walShmBarrier(pWal);
  memcpy((void*)&aHdr[0], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
}